

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.h
# Opt level: O1

void __thiscall
PerspectiveCamera::PerspectiveCamera
          (PerspectiveCamera *this,Vector3f *center,Vector3f *direction,Vector3f *up,
          float angleradians)

{
  Vector3f local_2c;
  
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR__Camera_0013fd18;
  Vector3f::Vector3f(&this->_center,center);
  Vector3f::normalized(&this->_direction);
  Vector3f::Vector3f(&this->_up,up);
  this->_angle = angleradians;
  Vector3f::Vector3f(&this->_horizontal,0.0);
  Vector3f::cross(direction,up);
  Vector3f::normalized(&local_2c);
  Vector3f::operator=(&this->_horizontal,&local_2c);
  return;
}

Assistant:

PerspectiveCamera(const Vector3f &center,
                      const Vector3f &direction,
                      const Vector3f &up,
                      float angleradians) :
            _center(center),
            _direction(direction.normalized()),
            _up(up),
            _angle(angleradians) {
        _horizontal = Vector3f::cross(direction, up).normalized();
    }